

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

tree_node * __thiscall RegexTree::copy_tree(RegexTree *this,tree_node *src)

{
  tree_node *ptVar1;
  tree_node *ret;
  tree_node *src_local;
  RegexTree *this_local;
  
  if (src == (tree_node *)0x0) {
    this_local = (RegexTree *)0x0;
  }
  else {
    this_local = (RegexTree *)operator_new(0x18);
    tree_node::tree_node((tree_node *)this_local);
    ((tree_node *)this_local)->c = src->c;
    ptVar1 = copy_tree(this,src->left);
    ((tree_node *)this_local)->left = ptVar1;
    ptVar1 = copy_tree(this,src->right);
    ((tree_node *)this_local)->right = ptVar1;
  }
  return (tree_node *)this_local;
}

Assistant:

tree_node *RegexTree::copy_tree(tree_node *src) {
    if (src == nullptr) return nullptr;
    tree_node *ret = new tree_node;
    ret->c = src->c;
    ret->left = copy_tree(src->left);
    ret->right = copy_tree(src->right);
    return ret;
}